

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool_arg_max.cpp
# Opt level: O3

void bool_arg_max(vec<BoolView> *x,int offset,IntVar *y)

{
  BoolArgMax *this;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  IntView<0> _y;
  vec<BoolView> w;
  vec<BoolView> local_68;
  vec<BoolView> local_58;
  IntVar *local_48;
  BoolView local_40;
  
  local_68.sz = 0;
  local_68.cap = 0;
  local_68.data = (BoolView *)0x0;
  local_48 = y;
  if (x->sz != 0) {
    lVar3 = 8;
    uVar1 = 0;
    do {
      local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_40.s = *(bool *)((long)&(x->data->super_Var).super_Branching._vptr_Branching + lVar3 + 4
                            );
      local_40.v = *(int *)((long)&(x->data->super_Var).super_Branching._vptr_Branching + lVar3);
      vec<BoolView>::push(&local_68,&local_40);
      uVar1 = uVar1 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar1 < x->sz);
  }
  this = (BoolArgMax *)operator_new(0x38);
  uVar1 = local_68._0_8_ & 0xffffffff;
  local_58.sz = local_68.sz;
  local_58.cap = local_68.sz;
  local_58.data = (BoolView *)malloc(uVar1 << 4);
  if (uVar1 != 0) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      *(undefined ***)((long)local_58.data + lVar3 + -8) = &PTR_finished_0020bb98;
      *(undefined4 *)((long)&((local_58.data)->super_Var).super_Branching._vptr_Branching + lVar3) =
           *(undefined4 *)
            ((long)&((local_68.data)->super_Var).super_Branching._vptr_Branching + lVar3);
      *(undefined1 *)
       ((long)&((local_58.data)->super_Var).super_Branching._vptr_Branching + lVar3 + 4) =
           *(undefined1 *)
            ((long)&((local_68.data)->super_Var).super_Branching._vptr_Branching + lVar3 + 4);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < uVar1);
  }
  _y.a = 1;
  _y.b = 0;
  _y.var = local_48;
  BoolArgMax::BoolArgMax(this,&local_58,offset,_y);
  vec<BoolView>::~vec(&local_58);
  vec<BoolView>::~vec(&local_68);
  return;
}

Assistant:

void bool_arg_max(vec<BoolView>& x, int offset, IntVar* y) {
	vec<BoolView> w;
	for (unsigned int i = 0; i < x.size(); i++) {
		w.push(BoolView(x[i]));
	}
	new BoolArgMax(w, offset, IntView<>(y));
}